

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

char * cashew::JSPrinter::numToString(double d,bool finalize)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  ushort uVar12;
  undefined4 *puVar13;
  long lVar14;
  char *pcVar15;
  char *__s;
  undefined7 in_register_00000039;
  int iVar16;
  int i;
  char *pcVar17;
  long *in_FS_OFFSET;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  long lStack_a0;
  undefined4 local_78;
  double local_60;
  double local_58;
  double local_50;
  double temp;
  undefined2 local_40;
  char cStack_3e;
  char cStack_3d;
  undefined1 auStack_3c [4];
  unsigned_long_long tempULL;
  
  temp._4_4_ = (uint)CONCAT71(in_register_00000039,finalize);
  if (NAN(d)) {
    pcVar7 = "-NaN";
    pcVar17 = "-NaN";
  }
  else {
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      dVar21 = -d;
      if (-d <= d) {
        dVar21 = d;
      }
      local_78 = SUB84(dVar21,0);
      tempULL._7_1_ = ::wasm::isInteger(dVar21);
      pcVar17 = (char *)(*in_FS_OFFSET + 1);
      pcVar7 = (char *)(*in_FS_OFFSET + 1);
      temp._4_4_ = temp._4_4_ ^ 1;
      uVar19 = 0;
      uVar20 = 0x7ff80000;
      local_58 = NAN;
      iVar16 = 0;
      do {
        if (iVar16 == 2) {
          if (((double)CONCAT44(uVar20,uVar19) != local_58) ||
             (NAN((double)CONCAT44(uVar20,uVar19)) || NAN(local_58))) {
            bVar18 = (double)CONCAT44(uVar20,uVar19) <= local_58 &&
                     local_58 != (double)CONCAT44(uVar20,uVar19);
          }
          else {
            sVar10 = strlen(pcVar7);
            sVar11 = strlen(pcVar17);
            bVar18 = sVar10 < sVar11;
          }
          if (bVar18) {
            pcVar17 = pcVar7;
          }
          if (0.0 <= d) {
            return pcVar17;
          }
          pcVar17[-1] = '-';
          return pcVar17 + -1;
        }
        __s = pcVar17;
        if (iVar16 != 0) {
          __s = pcVar7;
        }
        if (tempULL._7_1_ == 0) {
          uVar6 = 0;
          do {
            if (uVar6 == 0x13) break;
            local_40 = 0x2e25;
            if (uVar6 < 10) {
              cStack_3e = (char)uVar6 + '0';
              pcVar15 = &cStack_3d;
              puVar13 = (undefined4 *)auStack_3c;
            }
            else {
              cStack_3e = '1';
              cStack_3d = (char)uVar6 + '&';
              pcVar15 = auStack_3c;
              puVar13 = (undefined4 *)((long)auStack_3c + 1);
            }
            *pcVar15 = (iVar16 == 0) + 'e';
            *(undefined1 *)puVar13 = 0;
            snprintf(__s,999,(char *)&local_40);
            __isoc99_sscanf(__s,"%lf",&local_50);
            uVar6 = uVar6 + 1;
          } while ((local_50 != dVar21) || (NAN(local_50) || NAN(dVar21)));
        }
        else {
          if (dVar21 < 0.0) {
            __assert_fail("d >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0x3d2,"static char *cashew::JSPrinter::numToString(double, bool)");
          }
          cVar4 = ::wasm::isUInteger64(dVar21);
          if (cVar4 == '\0') {
            pcVar15 = "%.0f";
            if (iVar16 != 0) {
              pcVar15 = "%e";
            }
            snprintf(__s,999,pcVar15,local_78);
            __isoc99_sscanf(__s,"%lf",&local_50);
          }
          else {
            uVar8 = ::wasm::toUInteger64(dVar21);
            bVar5 = (byte)temp._4_4_;
            pcVar15 = "%llu";
            if ((iVar16 != 0 & bVar5) != 0) {
              pcVar15 = "0x%llx";
            }
            snprintf(__s,999,pcVar15,uVar8);
            if ((iVar16 != 0 & bVar5) == 0) {
              __isoc99_sscanf(__s,"%lf",&local_50);
            }
            else {
              __isoc99_sscanf(pcVar7,"%llx",&local_40);
              local_50 = ((double)CONCAT44(0x45300000,auStack_3c) - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,
                                           CONCAT13(cStack_3d,CONCAT12(cStack_3e,local_40))) -
                         4503599627370496.0);
            }
          }
        }
        local_60 = ABS(local_50 - dVar21);
        if (iVar16 == 0) {
          local_60 = (double)CONCAT44(uVar20,uVar19);
          local_58 = ABS(local_50 - dVar21);
        }
        pcVar15 = strchr(__s,0x2e);
        uVar19 = SUB84(local_60,0);
        uVar20 = (undefined4)((ulong)local_60 >> 0x20);
        if (pcVar15 == (char *)0x0) {
          if ((tempULL._7_1_ & iVar16 != 0) == 0) {
            sVar10 = strlen(__s);
            uVar12 = 0xffff;
            lVar14 = 0;
            do {
              lVar2 = lVar14 + -1;
              uVar12 = uVar12 + 1;
              if ((long)(lVar14 + sVar10 + -1) < 0x19 && __s[lVar14 + -1 + sVar10] != '0') break;
              lVar3 = lVar14 + sVar10;
              lVar14 = lVar2;
            } while (__s < __s + lVar3 + -1);
            uVar6 = ~(uint)lVar2;
            if (2 < (int)uVar6) {
              __s[lVar2 + sVar10 + 1] = 'e';
              bVar5 = (byte)lVar2;
              if (uVar6 < 10) {
                bVar5 = ~bVar5;
                lVar14 = 2;
                lStack_a0 = 3;
              }
              else if (uVar6 < 100) {
                __s[lVar2 + sVar10 + 2] = (byte)~bVar5 / 10 | 0x30;
                bVar5 = ~((char)((uVar12 & 0xff) / 10) * '\n') - bVar5;
                lVar14 = 3;
                lStack_a0 = 4;
              }
              else {
                if (999 < uVar6) {
                  __assert_fail("num < 1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                                ,0x418,"static char *cashew::JSPrinter::numToString(double, bool)");
                }
                __s[lVar2 + sVar10 + 2] = (byte)((~(uint)lVar2 & 0xffff) / 100) | 0x30;
                __s[lVar2 + sVar10 + 3] =
                     (byte)(((ushort)(byte)~((char)(uVar12 / 100) * 'd') - (short)lVar2 & 0xff) / 10
                           ) | 0x30;
                bVar5 = ~((char)(uVar12 / 10) * '\n') - bVar5;
                lVar14 = 4;
                lStack_a0 = 5;
              }
              __s[lVar2 + lVar14 + sVar10] = bVar5 | 0x30;
              __s[lVar2 + lStack_a0 + sVar10] = '\0';
            }
          }
        }
        else {
          do {
            pcVar1 = pcVar15 + 1;
            pcVar15 = pcVar15 + 1;
          } while ((byte)(*pcVar1 - 0x30U) < 10);
          while (pcVar15[-1] == '0') {
            pcVar1 = pcVar15 + -1;
            pcVar9 = pcVar15;
            do {
              cVar4 = *pcVar9;
              pcVar9[-1] = cVar4;
              pcVar9 = pcVar9 + 1;
              pcVar15 = pcVar1;
            } while (cVar4 != '\0');
          }
          while (pcVar15 = __s, *__s == '0') {
            do {
              cVar4 = pcVar15[1];
              *pcVar15 = cVar4;
              pcVar15 = pcVar15 + 1;
            } while (cVar4 != '\0');
          }
        }
        iVar16 = iVar16 + 1;
      } while( true );
    }
    pcVar7 = "-Infinity";
    pcVar17 = "-Infinity";
  }
  pcVar17 = pcVar17 + 1;
  if ((long)d < 0) {
    pcVar17 = pcVar7;
  }
  return pcVar17;
}

Assistant:

static char* numToString(double d, bool finalize = true) {
    if (std::isnan(d)) {
      if (std::signbit(d)) {
        return (char*)"-NaN";
      } else {
        return (char*)"NaN";
      }
    } else if (!std::isfinite(d)) {
      if (std::signbit(d)) {
        return (char*)"-Infinity";
      } else {
        return (char*)"Infinity";
      }
    }
    bool neg = d < 0;
    if (neg) {
      d = -d;
    }
    // try to emit the fewest necessary characters
    bool integer = wasm::isInteger(d);
#define BUFFERSIZE 1000
    // f is normal, e is scientific for float, x for integer
    // These need to be thread-local because they are returned.
    thread_local char full_storage_f[BUFFERSIZE];
    thread_local char full_storage_e[BUFFERSIZE];
    // full has one more char, for a possible '-'
    char* storage_f = full_storage_f + 1;
    char* storage_e = full_storage_e + 1;
    auto err_f = std::numeric_limits<double>::quiet_NaN();
    auto err_e = std::numeric_limits<double>::quiet_NaN();
    for (int e = 0; e <= 1; e++) {
      char* buffer = e ? storage_e : storage_f;
      double temp;
      if (!integer) {
        char format[6];
        for (int i = 0; i <= 18; i++) {
          format[0] = '%';
          format[1] = '.';
          if (i < 10) {
            format[2] = '0' + i;
            format[3] = e ? 'e' : 'f';
            format[4] = 0;
          } else {
            format[2] = '1';
            format[3] = '0' + (i - 10);
            format[4] = e ? 'e' : 'f';
            format[5] = 0;
          }
          snprintf(buffer, BUFFERSIZE - 1, format, d);
          sscanf(buffer, "%lf", &temp);
          // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e   (%d), ", d, d,
          // buffer, temp, temp, temp == d);
          if (temp == d) {
            break;
          }
        }
      } else {
        // integer
        assert(d >= 0);
        if (wasm::isUInteger64(d)) {
          unsigned long long uu = wasm::toUInteger64(d);
          bool asHex = e && !finalize;
          snprintf(buffer, BUFFERSIZE - 1, asHex ? "0x%llx" : "%llu", uu);
          if (asHex) {
            unsigned long long tempULL;
            sscanf(buffer, "%llx", &tempULL);
            temp = (double)tempULL;
          } else {
            sscanf(buffer, "%lf", &temp);
          }
        } else {
          // too large for a machine integer, just use floats
          // even on integers, e with a dot is useful, e.g. 1.2e+200
          snprintf(buffer, BUFFERSIZE - 1, e ? "%e" : "%.0f", d);
          sscanf(buffer, "%lf", &temp);
        }
        // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e, %llu   (%d)\n", d,
        //      d, buffer, temp, temp, uu, temp == d);
      }
      (e ? err_e : err_f) = fabs(temp - d);
      // errv("current attempt: %.18f  =>  %s", d, buffer);
      // assert(temp == d);
      char* dot = strchr(buffer, '.');
      if (dot) {
        // remove trailing zeros
        char* end = dot + 1;
        while (*end >= '0' && *end <= '9') {
          end++;
        }
        end--;
        while (*end == '0') {
          char* copy = end;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
          end--;
        }
        // errv("%.18f  =>   %s", d, buffer);
        // remove preceding zeros
        while (*buffer == '0') {
          char* copy = buffer;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
        }
        // errv("%.18f ===>  %s", d, buffer);
      } else if (!integer || !e) {
        // no dot. try to change 12345000 => 12345e3
        char* end = strchr(buffer, 0);
        end--;
        char* test = end;
        // remove zeros, and also doubles can use at most 24 digits, we can
        // truncate any extras even if not zero
        while ((*test == '0' || test - buffer > 24) && test > buffer) {
          test--;
        }
        int num = end - test;
        if (num >= 3) {
          test++;
          test[0] = 'e';
          if (num < 10) {
            test[1] = '0' + num;
            test[2] = 0;
          } else if (num < 100) {
            test[1] = '0' + (num / 10);
            test[2] = '0' + (num % 10);
            test[3] = 0;
          } else {
            assert(num < 1000);
            test[1] = '0' + (num / 100);
            test[2] = '0' + (num % 100) / 10;
            test[3] = '0' + (num % 10);
            test[4] = 0;
          }
        }
      }
      // errv("..current attempt: %.18f  =>  %s", d, buffer);
    }
    // fprintf(stderr, "options:\n%s\n%s\n (first? %d)\n", storage_e, storage_f,
    //         strlen(storage_e) < strlen(storage_f));
    char* ret;
    if (err_e == err_f) {
      ret = strlen(storage_e) < strlen(storage_f) ? storage_e : storage_f;
    } else {
      ret = err_e < err_f ? storage_e : storage_f;
    }
    if (neg) {
      ret--; // safe to go back one, there is one more char in full_*
      *ret = '-';
    }
    return ret;
  }